

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O0

bool __thiscall r_exec::HLPOverlay::scan_bwd_guards(HLPOverlay *this)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  short sVar4;
  uint16_t uVar5;
  undefined4 local_24;
  ushort local_20;
  ushort local_1e;
  Atom a;
  uint16_t index;
  uint16_t i;
  uint16_t guard_count;
  uint16_t guard_set_index;
  HLPOverlay *this_local;
  
  sVar4 = r_code::Atom::asIndex();
  bVar1 = r_code::Atom::getAtomCount();
  _a = (ushort)bVar1;
  for (local_1e = 1; local_1e <= _a; local_1e = local_1e + 1) {
    local_20 = sVar4 + local_1e;
    local_24 = *(undefined4 *)((this->super_Overlay).code + (ulong)local_20 * 4);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x7c) {
      uVar5 = r_code::Atom::asIndex();
      bVar3 = scan_location(this,uVar5);
      if (bVar3) goto LAB_0024d1db;
      this_local._7_1_ = 0;
      bVar3 = true;
    }
    else {
      if (cVar2 == -0x73) {
        uVar5 = r_code::Atom::asIndex();
        bVar3 = scan_location(this,uVar5);
        if (!bVar3) {
          this_local._7_1_ = 0;
          bVar3 = true;
          goto LAB_0024d1e2;
        }
      }
LAB_0024d1db:
      bVar3 = false;
    }
LAB_0024d1e2:
    r_code::Atom::~Atom((Atom *)&local_24);
    if (bVar3) goto LAB_0024d20d;
  }
  this_local._7_1_ = 1;
LAB_0024d20d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool HLPOverlay::scan_bwd_guards()
{
    uint16_t guard_set_index = code[HLP_BWD_GUARDS].asIndex();
    uint16_t guard_count = code[guard_set_index].getAtomCount();

    for (uint16_t i = 1; i <= guard_count; ++i) {
        uint16_t index = guard_set_index + i;
        Atom a = code[index];

        switch (a.getDescriptor()) {
        case Atom::I_PTR:
            if (!scan_location(a.asIndex())) {
                return false;
            }

            break;

        case Atom::ASSIGN_PTR:
            if (!scan_location(a.asIndex())) {
                return false;
            }

            break;
        }
    }

    return true;
}